

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  long in_FS_OFFSET;
  int local_f0;
  allocator<char> local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00184898;
  if (this->read_fd_ == -1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CHECK failed: File ",&local_e9);
    std::operator+(&local_a8,&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_88,&local_a8,", line ");
    local_f0 = 0x191;
    StreamableToString<int>(&local_e8,&local_f0);
    std::operator+(&local_68,&local_88,&local_e8);
    std::operator+(&local_48,&local_68,": ");
    std::operator+(&local_28,&local_48,"read_fd_ == -1");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      DeathTestAbort(&local_28);
    }
  }
  __stack_chk_fail();
}

Assistant:

~DeathTestImpl() { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }